

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hulog.cpp
# Opt level: O3

bool log_is_valid_callstack(int callstack_depth,void **callstack,bool is_alloc)

{
  int iVar1;
  int iVar2;
  _Rb_tree_header *p_Var3;
  char *__path;
  char *pcVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  undefined7 in_register_00000011;
  bool bVar7;
  ulong uVar8;
  _Base_ptr p_Var9;
  string objfile;
  void *addr;
  Dl_info dlinfo;
  allocator local_a5;
  undefined4 local_a4;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  void **local_80;
  void *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  char *local_50 [4];
  
  local_a4 = (undefined4)CONCAT71(in_register_00000011,is_alloc);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  uVar8 = (ulong)(uint)callstack_depth;
  local_80 = callstack;
  do {
    iVar2 = (int)uVar8;
    if (iVar2 < 2) goto LAB_001077fc;
    uVar8 = uVar8 - 1;
    local_78 = callstack[uVar8];
    p_Var6 = (objfile_cache_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var6 == (_Base_ptr)0x0) {
LAB_0010771d:
      iVar1 = dladdr(local_78,local_50);
      if (local_50[0] != (char *)0x0 && iVar1 != 0) {
        __path = strdup(local_50[0]);
        if (__path != (char *)0x0) {
          pcVar4 = __xpg_basename(__path);
          std::__cxx11::string::string((string *)local_70,pcVar4,&local_a5);
          std::__cxx11::string::operator=((string *)&local_a0,(string *)local_70);
          if (local_70[0] != local_60) {
            operator_delete(local_70[0]);
          }
          pmVar5 = std::
                   map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](objfile_cache_abi_cxx11_,&local_78);
          std::__cxx11::string::_M_assign((string *)pmVar5);
          free(__path);
          callstack = local_80;
        }
      }
    }
    else {
      p_Var3 = &(objfile_cache_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header;
      p_Var9 = &p_Var3->_M_header;
      do {
        if (*(void **)(p_Var6 + 1) >= local_78) {
          p_Var9 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[*(void **)(p_Var6 + 1) < local_78];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var9 == p_Var3) || (local_78 < *(void **)(p_Var9 + 1)))
      goto LAB_0010771d;
      std::__cxx11::string::_M_assign((string *)&local_a0);
    }
  } while (local_98 == 0);
  if (1 < iVar2 && (char)local_a4 == '\0') {
    iVar2 = std::__cxx11::string::compare((char *)&local_a0);
    if (iVar2 == 0) {
      bVar7 = false;
      goto LAB_001077fe;
    }
  }
LAB_001077fc:
  bVar7 = true;
LAB_001077fe:
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  return bVar7;
}

Assistant:

bool log_is_valid_callstack(int callstack_depth, void * const callstack[], bool is_alloc)
{
  int i = callstack_depth - 1;
  std::string objfile;
  while (i > 0)
  {
    void *addr = callstack[i];

    auto it = objfile_cache->find(addr);
    if (it != objfile_cache->end())
    {
      objfile = it->second;
    }
    else
    {
      Dl_info dlinfo;
      if (dladdr(addr, &dlinfo) && dlinfo.dli_fname)
      {
        char *fname = strdup(dlinfo.dli_fname);
        if (fname)
        {
          objfile = std::string(basename(fname));
          (*objfile_cache)[addr] = objfile;
          free(fname);
        }
      }
    }

    if (!objfile.empty())
    {
      // For now only care about originating object file
      break;
    }
      
    --i;
  }

  if (!objfile.empty())
  {
      // ignore invalid dealloc from libobjc
      if (!is_alloc && (objfile == "libobjc.A.dylib")) return false;
  }

  return true;
}